

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers_unittest.cc
# Opt level: O2

void Test_TemplateModifiers_CleanseAttribute::Run(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  TemplateString TVar3;
  TemplateString TVar4;
  TemplateString TVar5;
  TemplateString TVar6;
  TemplateString TVar7;
  TemplateString TVar8;
  TemplateString TVar9;
  TemplateString TVar10;
  TemplateString TVar11;
  TemplateString TVar12;
  TemplateString TVar13;
  TemplateString TVar14;
  TemplateString TVar15;
  TemplateString TVar16;
  int iVar17;
  char *pcVar18;
  TemplateDictionaryPeer peer;
  TemplateString local_298;
  TemplateDictionary dict;
  TemplateString local_208;
  TemplateString local_1e8;
  TemplateString local_1c8;
  TemplateString local_1a8;
  TemplateString local_188;
  TemplateString local_168;
  TemplateString local_148;
  TemplateString local_128;
  TemplateString local_108;
  TemplateString local_e8;
  TemplateString local_c8;
  TemplateString local_a8;
  TemplateString local_88;
  TemplateString local_68;
  TemplateString local_48;
  TemplateString local_28;
  
  ctemplate::TemplateString::TemplateString(&local_298,"TestCleanseAttribute");
  ctemplate::TemplateDictionary::TemplateDictionary(&dict,&local_298,(UnsafeArena *)0x0);
  ctemplate::TemplateString::TemplateString(&local_28,"easy attribute");
  ctemplate::TemplateString::TemplateString(&local_48,"top");
  TVar1.length_ = local_28.length_;
  TVar1.ptr_ = local_28.ptr_;
  TVar1.is_immutable_ = local_28.is_immutable_;
  TVar1._17_7_ = local_28._17_7_;
  TVar1.id_ = local_28.id_;
  TVar9.length_ = local_48.length_;
  TVar9.ptr_ = local_48.ptr_;
  TVar9.is_immutable_ = local_48.is_immutable_;
  TVar9._17_7_ = local_48._17_7_;
  TVar9.id_ = local_48.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar1,TVar9,(TemplateModifier *)&dict);
  ctemplate::TemplateString::TemplateString(&local_68,"harder attribute");
  ctemplate::TemplateString::TemplateString(&local_88,"foo & bar");
  TVar2.length_ = local_68.length_;
  TVar2.ptr_ = local_68.ptr_;
  TVar2.is_immutable_ = local_68.is_immutable_;
  TVar2._17_7_ = local_68._17_7_;
  TVar2.id_ = local_68.id_;
  TVar10.length_ = local_88.length_;
  TVar10.ptr_ = local_88.ptr_;
  TVar10.is_immutable_ = local_88.is_immutable_;
  TVar10._17_7_ = local_88._17_7_;
  TVar10.id_ = local_88.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar2,TVar10,(TemplateModifier *)&dict);
  ctemplate::TemplateString::TemplateString(&local_a8,"hardest attribute");
  ctemplate::TemplateString::TemplateString(&local_c8,"top onclick=\'alert(document.cookie)\'");
  TVar3.length_ = local_a8.length_;
  TVar3.ptr_ = local_a8.ptr_;
  TVar3.is_immutable_ = local_a8.is_immutable_;
  TVar3._17_7_ = local_a8._17_7_;
  TVar3.id_ = local_a8.id_;
  TVar11.length_ = local_c8.length_;
  TVar11.ptr_ = local_c8.ptr_;
  TVar11.is_immutable_ = local_c8.is_immutable_;
  TVar11._17_7_ = local_c8._17_7_;
  TVar11.id_ = local_c8.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar3,TVar11,(TemplateModifier *)&dict);
  ctemplate::TemplateString::TemplateString(&local_e8,"equal in middle");
  ctemplate::TemplateString::TemplateString(&local_108,"foo = bar");
  TVar4.length_ = local_e8.length_;
  TVar4.ptr_ = local_e8.ptr_;
  TVar4.is_immutable_ = local_e8.is_immutable_;
  TVar4._17_7_ = local_e8._17_7_;
  TVar4.id_ = local_e8.id_;
  TVar12.length_ = local_108.length_;
  TVar12.ptr_ = local_108.ptr_;
  TVar12.is_immutable_ = local_108.is_immutable_;
  TVar12._17_7_ = local_108._17_7_;
  TVar12.id_ = local_108.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar4,TVar12,(TemplateModifier *)&dict);
  ctemplate::TemplateString::TemplateString(&local_128,"leading equal");
  ctemplate::TemplateString::TemplateString(&local_148,"=foo");
  TVar5.length_ = local_128.length_;
  TVar5.ptr_ = local_128.ptr_;
  TVar5.is_immutable_ = local_128.is_immutable_;
  TVar5._17_7_ = local_128._17_7_;
  TVar5.id_ = local_128.id_;
  TVar13.length_ = local_148.length_;
  TVar13.ptr_ = local_148.ptr_;
  TVar13.is_immutable_ = local_148.is_immutable_;
  TVar13._17_7_ = local_148._17_7_;
  TVar13.id_ = local_148.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar5,TVar13,(TemplateModifier *)&dict);
  ctemplate::TemplateString::TemplateString(&local_168,"trailing equal");
  ctemplate::TemplateString::TemplateString(&local_188,"foo=");
  TVar6.length_ = local_168.length_;
  TVar6.ptr_ = local_168.ptr_;
  TVar6.is_immutable_ = local_168.is_immutable_;
  TVar6._17_7_ = local_168._17_7_;
  TVar6.id_ = local_168.id_;
  TVar14.length_ = local_188.length_;
  TVar14.ptr_ = local_188.ptr_;
  TVar14.is_immutable_ = local_188.is_immutable_;
  TVar14._17_7_ = local_188._17_7_;
  TVar14.id_ = local_188.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar6,TVar14,(TemplateModifier *)&dict);
  ctemplate::TemplateString::TemplateString(&local_1a8,"all equals");
  ctemplate::TemplateString::TemplateString(&local_1c8,"===foo===bar===");
  TVar7.length_ = local_1a8.length_;
  TVar7.ptr_ = local_1a8.ptr_;
  TVar7.is_immutable_ = local_1a8.is_immutable_;
  TVar7._17_7_ = local_1a8._17_7_;
  TVar7.id_ = local_1a8.id_;
  TVar15.length_ = local_1c8.length_;
  TVar15.ptr_ = local_1c8.ptr_;
  TVar15.is_immutable_ = local_1c8.is_immutable_;
  TVar15._17_7_ = local_1c8._17_7_;
  TVar15.id_ = local_1c8.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar7,TVar15,(TemplateModifier *)&dict);
  ctemplate::TemplateString::TemplateString(&local_1e8,"just equals");
  ctemplate::TemplateString::TemplateString(&local_208,"===");
  TVar8.length_ = local_1e8.length_;
  TVar8.ptr_ = local_1e8.ptr_;
  TVar8.is_immutable_ = local_1e8.is_immutable_;
  TVar8._17_7_ = local_1e8._17_7_;
  TVar8.id_ = local_1e8.id_;
  TVar16.length_ = local_208.length_;
  TVar16.ptr_ = local_208.ptr_;
  TVar16.is_immutable_ = local_208.is_immutable_;
  TVar16._17_7_ = local_208._17_7_;
  TVar16.id_ = local_208.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar8,TVar16,(TemplateModifier *)&dict);
  peer.dict_ = &dict;
  ctemplate::TemplateString::TemplateString(&local_298,"easy attribute");
  pcVar18 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&peer,&local_298);
  iVar17 = strcmp(pcVar18,"top");
  if (iVar17 == 0) {
    ctemplate::TemplateString::TemplateString(&local_298,"harder attribute");
    pcVar18 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&peer,&local_298);
    iVar17 = strcmp(pcVar18,"foo___bar");
    if (iVar17 == 0) {
      ctemplate::TemplateString::TemplateString(&local_298,"hardest attribute");
      pcVar18 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&peer,&local_298);
      iVar17 = strcmp(pcVar18,"top_onclick=_alert_document.cookie__");
      if (iVar17 == 0) {
        ctemplate::TemplateString::TemplateString(&local_298,"equal in middle");
        pcVar18 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&peer,&local_298);
        iVar17 = strcmp(pcVar18,"foo_=_bar");
        if (iVar17 == 0) {
          ctemplate::TemplateString::TemplateString(&local_298,"leading equal");
          pcVar18 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&peer,&local_298);
          iVar17 = strcmp(pcVar18,"_foo");
          if (iVar17 == 0) {
            ctemplate::TemplateString::TemplateString(&local_298,"trailing equal");
            pcVar18 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&peer,&local_298);
            iVar17 = strcmp(pcVar18,"foo_");
            if (iVar17 == 0) {
              ctemplate::TemplateString::TemplateString(&local_298,"just equals");
              pcVar18 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&peer,&local_298);
              iVar17 = strcmp(pcVar18,"_=_");
              if (iVar17 == 0) {
                ctemplate::TemplateString::TemplateString(&local_298,"all equals");
                pcVar18 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&peer,&local_298);
                iVar17 = strcmp(pcVar18,"_==foo===bar==_");
                if (iVar17 == 0) {
                  ctemplate::TemplateDictionary::~TemplateDictionary(&dict);
                  return;
                }
                pcVar18 = "strcmp(peer.GetSectionValue(\"all equals\"), \"_==foo===bar==_\") == 0";
              }
              else {
                pcVar18 = "strcmp(peer.GetSectionValue(\"just equals\"), \"_=_\") == 0";
              }
            }
            else {
              pcVar18 = "strcmp(peer.GetSectionValue(\"trailing equal\"), \"foo_\") == 0";
            }
          }
          else {
            pcVar18 = "strcmp(peer.GetSectionValue(\"leading equal\"), \"_foo\") == 0";
          }
        }
        else {
          pcVar18 = "strcmp(peer.GetSectionValue(\"equal in middle\"), \"foo_=_bar\") == 0";
        }
      }
      else {
        pcVar18 = 
        "strcmp(peer.GetSectionValue(\"hardest attribute\"), \"top_onclick=_alert_document.cookie__\") == 0"
        ;
      }
    }
    else {
      pcVar18 = "strcmp(peer.GetSectionValue(\"harder attribute\"), \"foo___bar\") == 0";
    }
  }
  else {
    pcVar18 = "strcmp(peer.GetSectionValue(\"easy attribute\"), \"top\") == 0";
  }
  fprintf(_stderr,"Check failed: %s\n",pcVar18);
  exit(1);
}

Assistant:

TEST(TemplateModifiers, CleanseAttribute) {
  GOOGLE_NAMESPACE::TemplateDictionary dict("TestCleanseAttribute", NULL);
  dict.SetEscapedValue("easy attribute", "top",
                       GOOGLE_NAMESPACE::cleanse_attribute);
  dict.SetEscapedValue("harder attribute", "foo & bar",
                       GOOGLE_NAMESPACE::cleanse_attribute);
  dict.SetEscapedValue("hardest attribute",
                       "top onclick='alert(document.cookie)'",
                       GOOGLE_NAMESPACE::cleanse_attribute);
  dict.SetEscapedValue("equal in middle", "foo = bar",
                       GOOGLE_NAMESPACE::cleanse_attribute);
  dict.SetEscapedValue("leading equal", "=foo",
                       GOOGLE_NAMESPACE::cleanse_attribute);
  dict.SetEscapedValue("trailing equal", "foo=",
                       GOOGLE_NAMESPACE::cleanse_attribute);
  dict.SetEscapedValue("all equals", "===foo===bar===",
                       GOOGLE_NAMESPACE::cleanse_attribute);
  dict.SetEscapedValue("just equals", "===",
                       GOOGLE_NAMESPACE::cleanse_attribute);

  GOOGLE_NAMESPACE::TemplateDictionaryPeer peer(&dict);  // peer can look inside dicts
  EXPECT_STREQ(peer.GetSectionValue("easy attribute"), "top");
  EXPECT_STREQ(peer.GetSectionValue("harder attribute"), "foo___bar");
  EXPECT_STREQ(peer.GetSectionValue("hardest attribute"),
               "top_onclick=_alert_document.cookie__");

  EXPECT_STREQ(peer.GetSectionValue("equal in middle"), "foo_=_bar");
  EXPECT_STREQ(peer.GetSectionValue("leading equal"), "_foo");
  EXPECT_STREQ(peer.GetSectionValue("trailing equal"), "foo_");
  EXPECT_STREQ(peer.GetSectionValue("just equals"), "_=_");
  EXPECT_STREQ(peer.GetSectionValue("all equals"), "_==foo===bar==_");
}